

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lodepng.cpp
# Opt level: O0

uint lodepng_encode(uchar **out,size_t *outsize,uchar *image,uint w,uint h,LodePNGState *state)

{
  uint uVar1;
  int iVar2;
  size_t sVar3;
  int in_ECX;
  uchar **in_RDX;
  undefined8 *in_RSI;
  LodePNGEncoderSettings *in_RDI;
  int in_R8D;
  uchar *in_R9;
  uint alread_added_id_text;
  size_t i;
  size_t size;
  uchar *converted;
  size_t datasize;
  uchar *data;
  ucvector outv;
  LodePNGInfo info;
  LodePNGColorMode *in_stack_000002d0;
  uint in_stack_000002d8;
  uint in_stack_000002dc;
  uchar *in_stack_000002e0;
  LodePNGColorMode *in_stack_000002e8;
  LodePNGInfo *in_stack_fffffffffffffe90;
  LodePNGInfo *in_stack_fffffffffffffe98;
  uint in_stack_fffffffffffffea0;
  LodePNGColorType in_stack_fffffffffffffea4;
  LodePNGInfo *in_stack_fffffffffffffea8;
  char *pcVar4;
  ucvector *in_stack_fffffffffffffeb0;
  LodePNGColorMode *in_stack_fffffffffffffeb8;
  ucvector *puVar5;
  LodePNGCompressSettings *in_stack_fffffffffffffed0;
  char *in_stack_fffffffffffffed8;
  char *in_stack_fffffffffffffee0;
  ucvector *in_stack_fffffffffffffee8;
  uint in_stack_fffffffffffffef4;
  LodePNGColorType in_stack_fffffffffffffef8;
  uint in_stack_fffffffffffffefc;
  uchar *local_100;
  ulong local_f8;
  uint in_stack_ffffffffffffff10;
  uint in_stack_ffffffffffffff14;
  int local_e0;
  char *local_d0;
  long local_c8;
  ucvector *local_b8;
  long local_b0;
  uint in_stack_ffffffffffffff68;
  uint in_stack_ffffffffffffff6c;
  int in_stack_ffffffffffffff70;
  undefined4 in_stack_ffffffffffffff74;
  LodePNGColorMode *in_stack_ffffffffffffff78;
  uchar *in_stack_ffffffffffffff80;
  undefined4 in_stack_ffffffffffffff88;
  int in_stack_ffffffffffffff8c;
  long local_60;
  long local_58;
  long local_50;
  LodePNGInfo *in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  uint in_stack_ffffffffffffffcc;
  
  puVar5 = (ucvector *)0x0;
  (in_RDI->zlibsettings).btype = 0;
  (in_RDI->zlibsettings).use_lz77 = 0;
  *in_RSI = 0;
  in_R9[0x1a0] = '\0';
  in_R9[0x1a1] = '\0';
  in_R9[0x1a2] = '\0';
  in_R9[0x1a3] = '\0';
  lodepng_info_init((LodePNGInfo *)0x1122e2);
  lodepng_info_copy(in_stack_fffffffffffffe98,in_stack_fffffffffffffe90);
  if (((in_stack_fffffffffffffef8 == LCT_PALETTE) || (*(int *)(in_R9 + 0x80) != 0)) &&
     ((local_f8 == 0 || (0x100 < local_f8)))) {
    in_R9[0x1a0] = 'D';
    in_R9[0x1a1] = '\0';
    in_R9[0x1a2] = '\0';
    in_R9[0x1a3] = '\0';
    return *(uint *)(in_R9 + 0x1a0);
  }
  if (*(int *)(in_R9 + 0x68) != 0) {
    uVar1 = lodepng_auto_choose_color
                      (in_stack_000002e8,in_stack_000002e0,in_stack_000002dc,in_stack_000002d8,
                       in_stack_000002d0);
    *(uint *)(in_R9 + 0x1a0) = uVar1;
  }
  if (*(int *)(in_R9 + 0x1a0) != 0) {
    return *(uint *)(in_R9 + 0x1a0);
  }
  if (2 < *(uint *)(in_R9 + 0x38)) {
    in_R9[0x1a0] = '=';
    in_R9[0x1a1] = '\0';
    in_R9[0x1a2] = '\0';
    in_R9[0x1a3] = '\0';
    return 0x3d;
  }
  if (1 < *(uint *)(in_R9 + 0xc0)) {
    in_R9[0x1a0] = 'G';
    in_R9[0x1a1] = '\0';
    in_R9[0x1a2] = '\0';
    in_R9[0x1a3] = '\0';
    return 0x47;
  }
  uVar1 = checkColorValidity(in_stack_fffffffffffffef8,in_stack_fffffffffffffefc);
  *(uint *)(in_R9 + 0x1a0) = uVar1;
  if (*(int *)(in_R9 + 0x1a0) != 0) {
    return *(uint *)(in_R9 + 0x1a0);
  }
  uVar1 = checkColorValidity(*(LodePNGColorType *)(in_R9 + 0x90),*(uint *)(in_R9 + 0x94));
  *(uint *)(in_R9 + 0x1a0) = uVar1;
  if (*(int *)(in_R9 + 0x1a0) != 0) {
    return *(uint *)(in_R9 + 0x1a0);
  }
  iVar2 = lodepng_color_mode_equal
                    ((LodePNGColorMode *)(in_R9 + 0x90),(LodePNGColorMode *)&stack0xfffffffffffffef8
                    );
  if (iVar2 == 0) {
    in_stack_fffffffffffffe98 = (LodePNGInfo *)(ulong)(uint)(in_ECX * in_R8D);
    uVar1 = lodepng_get_bpp((LodePNGColorMode *)0x112525);
    in_stack_fffffffffffffeb0 =
         (ucvector *)((long)in_stack_fffffffffffffe98 * (ulong)uVar1 + 7 >> 3);
    in_stack_fffffffffffffeb8 = (LodePNGColorMode *)lodepng_malloc(0x112549);
    if ((in_stack_fffffffffffffeb8 == (LodePNGColorMode *)0x0) &&
       (in_stack_fffffffffffffeb0 != (ucvector *)0x0)) {
      in_R9[0x1a0] = 'S';
      in_R9[0x1a1] = '\0';
      in_R9[0x1a2] = '\0';
      in_R9[0x1a3] = '\0';
    }
    if (*(int *)(in_R9 + 0x1a0) == 0) {
      uVar1 = lodepng_convert((uchar *)CONCAT44(in_stack_ffffffffffffff8c,in_stack_ffffffffffffff88)
                              ,in_stack_ffffffffffffff80,in_stack_ffffffffffffff78,
                              (LodePNGColorMode *)
                              CONCAT44(in_stack_ffffffffffffff74,in_stack_ffffffffffffff70),
                              in_stack_ffffffffffffff6c,in_stack_ffffffffffffff68);
      *(uint *)(in_R9 + 0x1a0) = uVar1;
    }
    if (*(int *)(in_R9 + 0x1a0) == 0) {
      preProcessScanlines(in_RDX,(size_t *)CONCAT44(in_ECX,in_R8D),in_R9,in_stack_ffffffffffffffcc,
                          in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI);
    }
    lodepng_free((void *)0x11261e);
  }
  else {
    preProcessScanlines(in_RDX,(size_t *)CONCAT44(in_ECX,in_R8D),in_R9,in_stack_ffffffffffffffcc,
                        in_stack_ffffffffffffffc8,in_stack_ffffffffffffffc0,in_RDI);
  }
  ucvector_init((ucvector *)&stack0xfffffffffffffed0);
  if (*(int *)(in_R9 + 0x1a0) == 0) {
    writeSignature((ucvector *)0x11268c);
    addChunk_IHDR(in_stack_fffffffffffffeb0,(uint)((ulong)in_stack_fffffffffffffea8 >> 0x20),
                  (uint)in_stack_fffffffffffffea8,in_stack_fffffffffffffea4,
                  in_stack_fffffffffffffea0,(uint)((ulong)in_stack_fffffffffffffe98 >> 0x20));
    if (local_60 != 0) {
      uVar1 = addUnknownChunks((ucvector *)in_stack_fffffffffffffea8,
                               (uchar *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(size_t)in_stack_fffffffffffffe98);
      *(uint *)(in_R9 + 0x1a0) = uVar1;
      if (*(int *)(in_R9 + 0x1a0) != 0) goto LAB_00112b7c;
    }
    if (in_stack_fffffffffffffef8 == LCT_PALETTE) {
      addChunk_PLTE(in_stack_fffffffffffffeb0,(LodePNGColorMode *)in_stack_fffffffffffffea8);
    }
    if ((*(int *)(in_R9 + 0x80) != 0) &&
       ((in_stack_fffffffffffffef8 == LCT_RGB || (in_stack_fffffffffffffef8 == LCT_RGBA)))) {
      addChunk_PLTE(in_stack_fffffffffffffeb0,(LodePNGColorMode *)in_stack_fffffffffffffea8);
    }
    if ((in_stack_fffffffffffffef8 == LCT_PALETTE) &&
       (uVar1 = getPaletteTranslucency(local_100,local_f8), uVar1 != 0)) {
      addChunk_tRNS(puVar5,in_stack_fffffffffffffeb8);
    }
    if (((in_stack_fffffffffffffef8 == LCT_GREY) || (in_stack_fffffffffffffef8 == LCT_RGB)) &&
       (in_stack_ffffffffffffff10 != 0)) {
      addChunk_tRNS(puVar5,in_stack_fffffffffffffeb8);
    }
    if (local_e0 != 0) {
      addChunk_bKGD(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
    if (in_stack_ffffffffffffff8c != 0) {
      addChunk_pHYs(in_stack_fffffffffffffeb0,in_stack_fffffffffffffea8);
    }
    if (local_58 != 0) {
      uVar1 = addUnknownChunks((ucvector *)in_stack_fffffffffffffea8,
                               (uchar *)CONCAT44(in_stack_fffffffffffffea4,in_stack_fffffffffffffea0
                                                ),(size_t)in_stack_fffffffffffffe98);
      *(uint *)(in_R9 + 0x1a0) = uVar1;
      if (*(int *)(in_R9 + 0x1a0) != 0) goto LAB_00112b7c;
    }
    uVar1 = addChunk_IDAT(puVar5,(uchar *)in_stack_fffffffffffffeb8,
                          (size_t)in_stack_fffffffffffffeb0,
                          (LodePNGCompressSettings *)in_stack_fffffffffffffea8);
    *(uint *)(in_R9 + 0x1a0) = uVar1;
    if (*(int *)(in_R9 + 0x1a0) == 0) {
      if (in_stack_ffffffffffffff70 != 0) {
        addChunk_tIME((ucvector *)in_stack_fffffffffffffe98,(LodePNGTime *)in_stack_fffffffffffffe90
                     );
      }
      for (pcVar4 = (char *)0x0; pcVar4 != local_d0; pcVar4 = pcVar4 + 1) {
        sVar3 = strlen(*(char **)(local_c8 + (long)pcVar4 * 8));
        if (0x4f < sVar3) {
          in_R9[0x1a0] = 'B';
          in_R9[0x1a1] = '\0';
          in_R9[0x1a2] = '\0';
          in_R9[0x1a3] = '\0';
          break;
        }
        sVar3 = strlen(*(char **)(local_c8 + (long)pcVar4 * 8));
        if (sVar3 == 0) {
          in_R9[0x1a0] = 'C';
          in_R9[0x1a1] = '\0';
          in_R9[0x1a2] = '\0';
          in_R9[0x1a3] = '\0';
          break;
        }
        if (*(int *)(in_R9 + 0x88) == 0) {
          addChunk_tEXt((ucvector *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                        pcVar4);
        }
        else {
          addChunk_zTXt(in_stack_fffffffffffffee8,in_stack_fffffffffffffee0,
                        in_stack_fffffffffffffed8,in_stack_fffffffffffffed0);
        }
      }
      if (*(int *)(in_R9 + 0x84) != 0) {
        in_stack_fffffffffffffea4 = LCT_GREY;
        for (pcVar4 = (char *)0x0; pcVar4 != local_d0; pcVar4 = pcVar4 + 1) {
          iVar2 = strcmp(*(char **)(local_c8 + (long)pcVar4 * 8),"LodePNG");
          if (iVar2 == 0) {
            in_stack_fffffffffffffea4 = 1;
            break;
          }
        }
        if (in_stack_fffffffffffffea4 == LCT_GREY) {
          addChunk_tEXt((ucvector *)in_stack_fffffffffffffeb8,(char *)in_stack_fffffffffffffeb0,
                        pcVar4);
        }
      }
      for (puVar5 = (ucvector *)0x0; puVar5 != local_b8;
          puVar5 = (ucvector *)((long)&puVar5->data + 1)) {
        sVar3 = strlen(*(char **)(local_b0 + (long)puVar5 * 8));
        if (0x4f < sVar3) {
          in_R9[0x1a0] = 'B';
          in_R9[0x1a1] = '\0';
          in_R9[0x1a2] = '\0';
          in_R9[0x1a3] = '\0';
          break;
        }
        sVar3 = strlen(*(char **)(local_b0 + (long)puVar5 * 8));
        if (sVar3 == 0) {
          in_R9[0x1a0] = 'C';
          in_R9[0x1a1] = '\0';
          in_R9[0x1a2] = '\0';
          in_R9[0x1a3] = '\0';
          break;
        }
        addChunk_iTXt((ucvector *)CONCAT44(in_stack_fffffffffffffefc,in_stack_fffffffffffffef8),
                      in_stack_fffffffffffffef4,(char *)in_stack_fffffffffffffee8,
                      in_stack_fffffffffffffee0,in_stack_fffffffffffffed8,
                      (char *)in_stack_fffffffffffffed0,
                      (LodePNGCompressSettings *)
                      CONCAT44(in_stack_ffffffffffffff14,in_stack_ffffffffffffff10));
      }
      if (local_50 != 0) {
        uVar1 = addUnknownChunks(puVar5,(uchar *)CONCAT44(in_stack_fffffffffffffea4,
                                                          in_stack_fffffffffffffea0),
                                 (size_t)in_stack_fffffffffffffe98);
        *(uint *)(in_R9 + 0x1a0) = uVar1;
        if (*(int *)(in_R9 + 0x1a0) != 0) goto LAB_00112b7c;
      }
      addChunk_IEND((ucvector *)in_stack_fffffffffffffe90);
    }
  }
LAB_00112b7c:
  lodepng_info_cleanup((LodePNGInfo *)0x112b86);
  lodepng_free((void *)0x112b90);
  *(LodePNGCompressSettings **)&in_RDI->zlibsettings = in_stack_fffffffffffffed0;
  *in_RSI = in_stack_fffffffffffffed8;
  return *(uint *)(in_R9 + 0x1a0);
}

Assistant:

unsigned lodepng_encode(unsigned char** out, size_t* outsize,
                        const unsigned char* image, unsigned w, unsigned h,
                        LodePNGState* state)
{
  LodePNGInfo info;
  ucvector outv;
  unsigned char* data = 0; /*uncompressed version of the IDAT chunk data*/
  size_t datasize = 0;

  /*provide some proper output values if error will happen*/
  *out = 0;
  *outsize = 0;
  state->error = 0;

  lodepng_info_init(&info);
  lodepng_info_copy(&info, &state->info_png);

  if((info.color.colortype == LCT_PALETTE || state->encoder.force_palette)
      && (info.color.palettesize == 0 || info.color.palettesize > 256))
  {
    state->error = 68; /*invalid palette size, it is only allowed to be 1-256*/
    return state->error;
  }

  if(state->encoder.auto_convert)
  {
    state->error = lodepng_auto_choose_color(&info.color, image, w, h, &state->info_raw);
  }
  if(state->error) return state->error;

  if(state->encoder.zlibsettings.btype > 2)
  {
    CERROR_RETURN_ERROR(state->error, 61); /*error: unexisting btype*/
  }
  if(state->info_png.interlace_method > 1)
  {
    CERROR_RETURN_ERROR(state->error, 71); /*error: unexisting interlace mode*/
  }

  state->error = checkColorValidity(info.color.colortype, info.color.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/
  state->error = checkColorValidity(state->info_raw.colortype, state->info_raw.bitdepth);
  if(state->error) return state->error; /*error: unexisting color type given*/

  if(!lodepng_color_mode_equal(&state->info_raw, &info.color))
  {
    unsigned char* converted;
    size_t size = (w * h * (size_t)lodepng_get_bpp(&info.color) + 7) / 8;

    converted = (unsigned char*)lodepng_malloc(size);
    if(!converted && size) state->error = 83; /*alloc fail*/
    if(!state->error)
    {
      state->error = lodepng_convert(converted, image, &info.color, &state->info_raw, w, h);
    }
    if(!state->error) preProcessScanlines(&data, &datasize, converted, w, h, &info, &state->encoder);
    lodepng_free(converted);
  }
  else preProcessScanlines(&data, &datasize, image, w, h, &info, &state->encoder);

  ucvector_init(&outv);
  while(!state->error) /*while only executed once, to break on error*/
  {
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    size_t i;
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*write signature and chunks*/
    writeSignature(&outv);
    /*IHDR*/
    addChunk_IHDR(&outv, w, h, info.color.colortype, info.color.bitdepth, info.interlace_method);
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*unknown chunks between IHDR and PLTE*/
    if(info.unknown_chunks_data[0])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[0], info.unknown_chunks_size[0]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*PLTE*/
    if(info.color.colortype == LCT_PALETTE)
    {
      addChunk_PLTE(&outv, &info.color);
    }
    if(state->encoder.force_palette && (info.color.colortype == LCT_RGB || info.color.colortype == LCT_RGBA))
    {
      addChunk_PLTE(&outv, &info.color);
    }
    /*tRNS*/
    if(info.color.colortype == LCT_PALETTE && getPaletteTranslucency(info.color.palette, info.color.palettesize) != 0)
    {
      addChunk_tRNS(&outv, &info.color);
    }
    if((info.color.colortype == LCT_GREY || info.color.colortype == LCT_RGB) && info.color.key_defined)
    {
      addChunk_tRNS(&outv, &info.color);
    }
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*bKGD (must come between PLTE and the IDAt chunks*/
    if(info.background_defined) addChunk_bKGD(&outv, &info);
    /*pHYs (must come before the IDAT chunks)*/
    if(info.phys_defined) addChunk_pHYs(&outv, &info);

    /*unknown chunks between PLTE and IDAT*/
    if(info.unknown_chunks_data[1])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[1], info.unknown_chunks_size[1]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    /*IDAT (multiple IDAT chunks must be consecutive)*/
    state->error = addChunk_IDAT(&outv, data, datasize, &state->encoder.zlibsettings);
    if(state->error) break;
#ifdef LODEPNG_COMPILE_ANCILLARY_CHUNKS
    /*tIME*/
    if(info.time_defined) addChunk_tIME(&outv, &info.time);
    /*tEXt and/or zTXt*/
    for(i = 0; i != info.text_num; ++i)
    {
      if(strlen(info.text_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.text_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      if(state->encoder.text_compression)
      {
        addChunk_zTXt(&outv, info.text_keys[i], info.text_strings[i], &state->encoder.zlibsettings);
      }
      else
      {
        addChunk_tEXt(&outv, info.text_keys[i], info.text_strings[i]);
      }
    }
    /*LodePNG version id in text chunk*/
    if(state->encoder.add_id)
    {
      unsigned alread_added_id_text = 0;
      for(i = 0; i != info.text_num; ++i)
      {
        if(!strcmp(info.text_keys[i], "LodePNG"))
        {
          alread_added_id_text = 1;
          break;
        }
      }
      if(alread_added_id_text == 0)
      {
        addChunk_tEXt(&outv, "LodePNG", LODEPNG_VERSION_STRING); /*it's shorter as tEXt than as zTXt chunk*/
      }
    }
    /*iTXt*/
    for(i = 0; i != info.itext_num; ++i)
    {
      if(strlen(info.itext_keys[i]) > 79)
      {
        state->error = 66; /*text chunk too large*/
        break;
      }
      if(strlen(info.itext_keys[i]) < 1)
      {
        state->error = 67; /*text chunk too small*/
        break;
      }
      addChunk_iTXt(&outv, state->encoder.text_compression,
                    info.itext_keys[i], info.itext_langtags[i], info.itext_transkeys[i], info.itext_strings[i],
                    &state->encoder.zlibsettings);
    }

    /*unknown chunks between IDAT and IEND*/
    if(info.unknown_chunks_data[2])
    {
      state->error = addUnknownChunks(&outv, info.unknown_chunks_data[2], info.unknown_chunks_size[2]);
      if(state->error) break;
    }
#endif /*LODEPNG_COMPILE_ANCILLARY_CHUNKS*/
    addChunk_IEND(&outv);

    break; /*this isn't really a while loop; no error happened so break out now!*/
  }

  lodepng_info_cleanup(&info);
  lodepng_free(data);
  /*instead of cleaning the vector up, give it to the output*/
  *out = outv.data;
  *outsize = outv.size;

  return state->error;
}